

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

NodeAndBucket __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindHelper(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ViewType k)

{
  bool bVar1;
  map_index_t mVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  ViewType __x;
  NodeAndBucket NVar3;
  NodeBase *local_50;
  NodeBase *node;
  map_index_t b;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  ViewType k_local;
  
  AssertLoadFactor(this);
  mVar2 = BucketNumber(this,k);
  local_50 = (this->super_UntypedMapBase).table_[mVar2];
  do {
    if (local_50 == (NodeBase *)0x0) {
      k_local._M_str = (char *)0x0;
LAB_003a60b2:
      NVar3.bucket = mVar2;
      NVar3.node = (NodeBase *)k_local._M_str;
      NVar3._12_4_ = 0;
      return NVar3;
    }
    v = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        key((KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_50);
    __x = TransparentSupport<std::__cxx11::string>::ToView<std::__cxx11::string>(v);
    bVar1 = std::operator==(__x,k);
    if (bVar1) {
      k_local._M_str = (char *)local_50;
      goto LAB_003a60b2;
    }
    local_50 = local_50->next;
  } while( true );
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }